

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<ExternModuleInfo,_false,_false>::grow_and_add
          (FastVector<ExternModuleInfo,_false,_false> *this,uint newSize,ExternModuleInfo *val)

{
  uint uVar1;
  uint uVar2;
  ExternModuleInfo *ptr;
  ExternModuleInfo *pEVar3;
  uint oldMax;
  ExternModuleInfo *oldData;
  ExternModuleInfo *val_local;
  uint newSize_local;
  FastVector<ExternModuleInfo,_false,_false> *this_local;
  
  ptr = this->data;
  uVar1 = this->max;
  grow_no_destroy(this,newSize);
  uVar2 = this->count;
  this->count = uVar2 + 1;
  pEVar3 = this->data + uVar2;
  uVar2 = val->nameOffset;
  pEVar3->nameHash = val->nameHash;
  pEVar3->nameOffset = uVar2;
  uVar2 = val->funcCount;
  pEVar3->funcStart = val->funcStart;
  pEVar3->funcCount = uVar2;
  uVar2 = val->sourceOffset;
  pEVar3->variableOffset = val->variableOffset;
  pEVar3->sourceOffset = uVar2;
  pEVar3->sourceSize = val->sourceSize;
  if (ptr != (ExternModuleInfo *)0x0) {
    NULLC::destruct<ExternModuleInfo>(ptr,(ulong)uVar1);
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}